

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_bfffo_32_aw(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  sbyte sVar6;
  uint uVar7;
  uint uVar8;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) != 0) {
    my_fc_handler(m68ki_cpu.s_flag | 2);
    uVar7 = m68ki_cpu.pc & m68ki_cpu.address_mask;
    m68ki_cpu.pc = m68ki_cpu.pc + 2;
    my_fc_handler(m68ki_cpu.s_flag | 2);
    if (m68ki_cpu.pmmu_enabled != 0) {
      uVar7 = pmmu_translate_addr(uVar7);
    }
    uVar1 = m68k_read_memory_16(uVar7 & m68ki_cpu.address_mask);
    my_fc_handler(m68ki_cpu.s_flag | 2);
    uVar7 = m68ki_cpu.pc & m68ki_cpu.address_mask;
    m68ki_cpu.pc = m68ki_cpu.pc + 2;
    my_fc_handler(m68ki_cpu.s_flag | 2);
    if (m68ki_cpu.pmmu_enabled != 0) {
      uVar7 = pmmu_translate_addr(uVar7);
    }
    uVar2 = m68k_read_memory_16(uVar7 & m68ki_cpu.address_mask);
    if ((uVar1 >> 0xb & 1) == 0) {
      uVar7 = uVar1 >> 6 & 0x1f;
    }
    else {
      uVar7 = m68ki_cpu.dar[uVar1 >> 6 & 7];
    }
    uVar3 = uVar1;
    if ((uVar1 & 0x20) != 0) {
      uVar3 = m68ki_cpu.dar[uVar1 & 7];
    }
    uVar4 = uVar7 + 7;
    if (-1 < (int)uVar7) {
      uVar4 = uVar7;
    }
    uVar8 = ((int)uVar4 >> 3) + (int)(short)uVar2 + -1 + (uint)((uVar7 & 0x80000007) < 0x80000001);
    uVar2 = uVar3 - 1 & 0x1f;
    my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
    uVar3 = uVar8;
    if (m68ki_cpu.pmmu_enabled != 0) {
      uVar3 = pmmu_translate_addr(uVar8);
    }
    uVar4 = m68k_read_memory_32(uVar3 & m68ki_cpu.address_mask);
    sVar6 = (sbyte)(uVar7 & 7);
    uVar4 = uVar4 << sVar6;
    if (0x20 < (uVar7 & 7) + uVar2 + 1) {
      uVar8 = uVar8 + 4;
      my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
      if (m68ki_cpu.pmmu_enabled != 0) {
        uVar8 = pmmu_translate_addr(uVar8);
      }
      uVar5 = m68k_read_memory_8(uVar8 & m68ki_cpu.address_mask);
      uVar4 = uVar4 | (uVar5 << sVar6) >> 8;
    }
    m68ki_cpu.n_flag = uVar4 >> 0x18;
    m68ki_cpu.not_z_flag = uVar4 >> (~(byte)uVar2 & 0x1f);
    m68ki_cpu.v_flag = 0;
    m68ki_cpu.c_flag = 0;
    uVar4 = 1 << (byte)uVar2;
    uVar2 = m68ki_cpu.not_z_flag >> uVar2 & 1;
    while ((uVar2 == 0 && (uVar7 = uVar7 + 1, 1 < uVar4))) {
      uVar4 = uVar4 >> 1;
      uVar2 = uVar4 & m68ki_cpu.not_z_flag;
    }
    *(uint *)((long)m68ki_cpu.dar + (ulong)(uVar1 >> 10 & 0x1c)) = uVar7;
    return;
  }
  m68ki_exception_illegal();
  return;
}

Assistant:

static void m68k_op_bfffo_32_aw(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_16();
		sint offset = (word2>>6)&31;
		sint local_offset;
		uint width = word2;
		uint data;
		uint bit;
		uint ea = EA_AW_8();


		if(BIT_B(word2))
			offset = MAKE_INT_32(REG_D[offset&7]);
		if(BIT_5(word2))
			width = REG_D[width&7];

		/* Offset is signed so we have to use ugly math =( */
		ea += offset / 8;
		local_offset = offset % 8;
		if(local_offset < 0)
		{
			local_offset += 8;
			ea--;
		}
		width = ((width-1) & 31) + 1;

		data = m68ki_read_32(ea);
		data = MASK_OUT_ABOVE_32(data<<local_offset);

		if((local_offset+width) > 32)
			data |= (m68ki_read_8(ea+4) << local_offset) >> 8;

		FLAG_N = NFLAG_32(data);
		data  >>= (32 - width);

		FLAG_Z = data;
		FLAG_V = VFLAG_CLEAR;
		FLAG_C = CFLAG_CLEAR;

		for(bit = 1<<(width-1);bit && !(data & bit);bit>>= 1)
			offset++;

		REG_D[(word2>>12)&7] = offset;

		return;
	}
	m68ki_exception_illegal();
}